

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::load_iterator(Database *this,DatabaseName *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view_t fmt;
  OnDiskIterator local_180;
  
  OnDiskIterator::load(&local_180,name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OnDiskIterator>,std::_Select1st<std::pair<std::__cxx11::string_const,OnDiskIterator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OnDiskIterator>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,OnDiskIterator>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OnDiskIterator>,std::_Select1st<std::pair<std::__cxx11::string_const,OnDiskIterator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OnDiskIterator>>>
              *)&this->iterators,&name->id,&local_180);
  OnDiskIterator::~OnDiskIterator(&local_180);
  fmt.size_ = (size_t)&name->filename;
  fmt.data_ = (char *)0x8;
  spdlog::info<std::__cxx11::string>((spdlog *)"LOAD: {}",fmt,in_RCX);
  return;
}

Assistant:

void Database::load_iterator(const DatabaseName &name) {
    iterators.emplace(name.get_id(), OnDiskIterator::load(name));
    spdlog::info("LOAD: {}", name.get_filename());
}